

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.hpp
# Opt level: O1

void __thiscall
cs_impl::any::holder<cs::type_t>::holder<cs::struct_builder_const&,cs::type_id_const&>
          (holder<cs::type_t> *this,struct_builder *args,type_id *args_1)

{
  undefined4 uVar1;
  undefined4 uVar2;
  size_t sVar3;
  _Any_data local_38;
  _Manager_type local_28;
  _Invoker_type p_Stack_20;
  
  (this->super_baseHolder)._vptr_baseHolder = (_func_int **)&PTR__holder_0032f578;
  std::function<cs_impl::any()>::function<cs::struct_builder_const&,void>
            ((function<cs_impl::any()> *)local_38._M_pod_data,args);
  *(undefined8 *)&(this->mDat).constructor.super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->mDat).constructor.super__Function_base._M_functor + 8) = 0;
  (this->mDat).constructor.super__Function_base._M_manager = (_Manager_type)0x0;
  (this->mDat).constructor._M_invoker = p_Stack_20;
  if (local_28 != (_Manager_type)0x0) {
    *(void **)&(this->mDat).constructor.super__Function_base._M_functor =
         local_38._M_unused._M_object;
    *(undefined8 *)((long)&(this->mDat).constructor.super__Function_base._M_functor + 8) =
         local_38._8_8_;
    (this->mDat).constructor.super__Function_base._M_manager = local_28;
    local_28 = (_Manager_type)0x0;
    p_Stack_20 = (_Invoker_type)0x0;
  }
  (this->mDat).extensions.super___shared_ptr<cs::name_space,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->mDat).extensions.super___shared_ptr<cs::name_space,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  uVar1 = *(undefined4 *)((long)&(args_1->type_idx)._M_target + 4);
  sVar3 = args_1->type_hash;
  uVar2 = *(undefined4 *)((long)&args_1->type_hash + 4);
  *(undefined4 *)&(this->mDat).id.type_idx._M_target = *(undefined4 *)&(args_1->type_idx)._M_target;
  *(undefined4 *)((long)&(this->mDat).id.type_idx._M_target + 4) = uVar1;
  *(int *)&(this->mDat).id.type_hash = (int)sVar3;
  *(undefined4 *)((long)&(this->mDat).id.type_hash + 4) = uVar2;
  if (local_28 != (_Manager_type)0x0) {
    (*local_28)(&local_38,&local_38,__destroy_functor);
  }
  return;
}

Assistant:

explicit holder(ArgsT &&...args):mDat(std::forward<ArgsT>(args)...) {}